

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::convert_arg_for_ini
                   (string *__return_storage_ptr__,string *arg,char stringQuote,char literalQuote,
                   bool disable_multi_line)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  string *this;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this = (string *)&val;
  if (arg->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(ushort *)&__return_storage_ptr__->field_2 = (ushort)(byte)stringQuote * 0x101;
    __return_storage_ptr__->_M_string_length = 2;
    (__return_storage_ptr__->field_2)._M_local_buf[2] = '\0';
    return __return_storage_ptr__;
  }
  bVar3 = ::std::operator==(arg,"true");
  if ((((bVar3) || (bVar3 = ::std::operator==(arg,"false"), bVar3)) ||
      (bVar3 = ::std::operator==(arg,"nan"), bVar3)) ||
     (bVar3 = ::std::operator==(arg,"inf"), bVar3)) goto LAB_0016c0b2;
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (arg,0,2,"0x");
  if ((iVar4 != 0) &&
     (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(arg,0,2,"0X"), iVar4 != 0)) {
    val = 0.0;
    bVar3 = lexical_cast<double,_(CLI::detail::enabler)0>(arg,&val);
    if ((bVar3) &&
       (sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find_first_not_of(arg,"0123456789.-+eE",0), sVar5 == 0xffffffffffffffff))
    goto LAB_0016c0b2;
  }
  pbVar2 = (byte *)(arg->_M_dataplus)._M_p;
  sVar5 = arg->_M_string_length;
  if (sVar5 == 1) {
    iVar4 = isprint((uint)*pbVar2);
    if (iVar4 != 0) {
      bVar3 = ::std::operator==(arg,"\'");
      if (bVar3) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        local_68._M_string_length = 1;
        local_68.field_2._M_local_buf[1] = '\0';
        local_68.field_2._M_local_buf[0] = stringQuote;
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         &local_68,"\'");
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         stringQuote);
        this = (string *)&val;
      }
      else {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        local_68._M_string_length = 1;
        local_68.field_2._M_local_buf[1] = '\0';
        local_68.field_2._M_local_buf[0] = literalQuote;
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         &local_68,arg);
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         literalQuote);
        this = (string *)&val;
      }
      goto LAB_0016c347;
    }
    goto LAB_0016c2c3;
  }
  if (*pbVar2 == 0x30) {
    bVar1 = pbVar2[1];
    if (bVar1 == 0x62) {
      bVar3 = ::std::
              all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>
                        (pbVar2 + 2,pbVar2 + sVar5);
    }
    else if (bVar1 == 0x6f) {
      bVar3 = ::std::
              all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>
                        (pbVar2 + 2,pbVar2 + sVar5);
    }
    else {
      if (bVar1 != 0x78) goto LAB_0016c242;
      bVar3 = ::std::
              all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>
                        (pbVar2 + 2,pbVar2 + sVar5);
    }
    if (bVar3 != false) {
LAB_0016c0b2:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,arg);
      return __return_storage_ptr__;
    }
  }
LAB_0016c242:
  bVar3 = is_printable(arg);
  if (bVar3) {
    bVar3 = has_escapable_character(arg);
    if (bVar3) {
      if (arg->_M_string_length < 0x65 || disable_multi_line) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        local_68._M_string_length = 1;
        local_68.field_2._M_local_buf[1] = '\0';
        local_68.field_2._M_local_buf[0] = stringQuote;
        add_escaped_characters(&local_48,arg);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         &local_68,&local_48);
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         stringQuote);
        ::std::__cxx11::string::~string((string *)&val);
        this = &local_48;
      }
      else {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"\'\'\'",(allocator<char> *)&local_48);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         &local_68,arg);
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         "\'\'\'");
        this = (string *)&val;
      }
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 1;
      local_68.field_2._M_local_buf[1] = '\0';
      local_68.field_2._M_local_buf[0] = stringQuote;
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       &local_68,arg);
      ::std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       stringQuote);
    }
LAB_0016c347:
    ::std::__cxx11::string::~string((string *)this);
    ::std::__cxx11::string::~string((string *)&local_68);
    return __return_storage_ptr__;
  }
LAB_0016c2c3:
  binary_escape_string(__return_storage_ptr__,arg);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}